

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_memory_buffer<char,_250UL,_std::allocator<char>_> * __thiscall
fmt::v8::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::operator=
          (basic_memory_buffer<char,_250UL,_std::allocator<char>_> *this,
          basic_memory_buffer<char,_250UL,_std::allocator<char>_> *other)

{
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *in_RSI;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *in_RDI;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *in_stack_00000008;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *in_stack_00000010;
  bool local_11;
  
  local_11 = in_RDI != in_RSI;
  ignore_unused<bool,char[1]>(&local_11,(char (*) [1])0x1c6bb0);
  deallocate(in_RSI);
  move(in_stack_00000010,in_stack_00000008);
  return in_RDI;
}

Assistant:

auto operator=(basic_memory_buffer&& other) FMT_NOEXCEPT
      -> basic_memory_buffer& {
    FMT_ASSERT(this != &other, "");
    deallocate();
    move(other);
    return *this;
  }